

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void DLightTransfer::DoTransfer(int level,int target,bool floor)

{
  uint uVar1;
  undefined3 in_register_00000011;
  FSectorTagIterator itr;
  FSectorTagIterator local_20;
  
  local_20.searchtag = target;
  if (CONCAT31(in_register_00000011,floor) == 0) {
    if (target == 0) {
      local_20.start = 0;
    }
    else {
      local_20.start = tagManager.TagHashFirst[target & 0xff];
    }
    while( true ) {
      uVar1 = FSectorTagIterator::Next(&local_20);
      if ((int)uVar1 < 0) break;
      sectors[uVar1].planes[1].Light = level;
    }
  }
  else {
    if (target == 0) {
      local_20.start = 0;
    }
    else {
      local_20.start = tagManager.TagHashFirst[target & 0xff];
    }
    while( true ) {
      uVar1 = FSectorTagIterator::Next(&local_20);
      if ((int)uVar1 < 0) break;
      sectors[uVar1].planes[0].Light = level;
    }
  }
  return;
}

Assistant:

void DLightTransfer::DoTransfer (int level, int target, bool floor)
{
	int secnum;

	if (floor)
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].SetPlaneLight(sector_t::floor, level);
	}
	else
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].SetPlaneLight(sector_t::ceiling, level);
	}
}